

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.h
# Opt level: O2

void w128_to_bitstream(bitstream_t *bs,word128 *v,size_t width,size_t size)

{
  uint64_t *puVar1;
  uint64_t buf [4];
  
  puVar1 = buf + (width - 1);
  buf[0] = (*v)[0];
  buf[1] = (*v)[1];
  buf[2] = v[1][0];
  buf[3] = v[1][1];
  for (; 0x3f < size; size = size - 0x40) {
    bitstream_put_bits(bs,*puVar1,0x40);
    puVar1 = puVar1 + -1;
  }
  if (size != 0) {
    bitstream_put_bits(bs,*puVar1 >> ((ulong)(byte)-(char)size & 0x3f),(uint)size);
    return;
  }
  return;
}

Assistant:

ATTR_TARGET_S128
static inline void w128_to_bitstream(bitstream_t* bs, const word128 v[2], const size_t width,
                                     const size_t size) {
  ATTR_ALIGNED(16) uint64_t buf[4];
  mm128_store(&buf[0], v[0]);
  mm128_store(&buf[2], v[1]);

  const uint64_t* d = &buf[width - 1];
  size_t bits       = size;
  for (; bits >= sizeof(uint64_t) * 8; bits -= sizeof(uint64_t) * 8, --d) {
    bitstream_put_bits(bs, *d, sizeof(uint64_t) * 8);
  }
  if (bits) {
    bitstream_put_bits(bs, *d >> (sizeof(uint64_t) * 8 - bits), bits);
  }
}